

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O0

void nn_ws_handshake_start
               (nn_ws_handshake *self,nn_usock *usock,nn_pipebase *pipebase,int mode,char *resource,
               char *host)

{
  size_t sVar1;
  int in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  char *in_R8;
  undefined8 in_R9;
  bool bVar2;
  nn_fsm_owner *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int __c;
  
  if ((in_ECX == 1) && (sVar1 = strlen(in_R8), sVar1 == 0)) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","strlen (resource) >= 1",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/ws_handshake.c"
            ,0xc3);
    fflush(_stderr);
    nn_err_abort();
  }
  bVar2 = false;
  if (*(long *)(in_RDI + 0x150) == 0) {
    bVar2 = *(long *)(in_RDI + 0x160) == 0;
  }
  if (bVar2) {
    *(undefined4 *)(in_RDI + 0x158) = 1;
    *(long *)(in_RDI + 0x160) = in_RDI;
    nn_usock_swap_owner((nn_usock *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    *(undefined8 *)(in_RDI + 0x150) = in_RSI;
    *(undefined8 *)(in_RDI + 0x168) = in_RDX;
    *(int *)(in_RDI + 0x5c) = in_ECX;
    *(char **)(in_RDI + 0x170) = in_R8;
    *(undefined8 *)(in_RDI + 0x178) = in_R9;
    __c = 0;
    memset((void *)(in_RDI + 0x180),0,0x1000);
    memset((void *)(in_RDI + 0x128c),__c,0x200);
    *(undefined8 *)(in_RDI + 0x1188) = 0;
    *(undefined4 *)(in_RDI + 0x1180) = 0;
    if (*(int *)(in_RDI + 0x5c) == 1) {
      *(undefined8 *)(in_RDI + 0x1190) = 0x10;
    }
    else {
      if (*(int *)(in_RDI + 0x5c) != 2) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","0",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/ws_handshake.c"
                ,0xea);
        fflush(_stderr);
        nn_err_abort();
      }
      *(undefined8 *)(in_RDI + 0x1190) = 0x97;
    }
    nn_fsm_start((nn_fsm *)0x14bd71);
    return;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
          "self->usock == NULL && self->usock_owner.fsm == NULL",
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/ws_handshake.c"
          ,0xc6);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_ws_handshake_start (struct nn_ws_handshake *self,
    struct nn_usock *usock, struct nn_pipebase *pipebase,
    int mode, const char *resource, const char *host)
{
    /*  It's expected this resource has been allocated during intial connect. */
    if (mode == NN_WS_CLIENT)
        nn_assert (strlen (resource) >= 1);

    /*  Take ownership of the underlying socket. */
    nn_assert (self->usock == NULL && self->usock_owner.fsm == NULL);
    self->usock_owner.src = NN_WS_HANDSHAKE_SRC_USOCK;
    self->usock_owner.fsm = &self->fsm;
    nn_usock_swap_owner (usock, &self->usock_owner);
    self->usock = usock;
    self->pipebase = pipebase;
    self->mode = mode;
    self->resource = resource;
    self->remote_host = host;

    memset (self->opening_hs, 0, sizeof (self->opening_hs));
    memset (self->response, 0, sizeof (self->response));

    self->recv_pos = 0;
    self->retries = 0;

    /*  Calculate the absolute minimum length possible for a valid opening
        handshake. This is an optimization since we must poll for the
        remainder of the opening handshake in small byte chunks. */
    switch (self->mode) {
    case NN_WS_SERVER:
        self->recv_len = strlen (
            "GET x HTTP/1.1\r\n"
            "Upgrade: websocket\r\n"
            "Connection: Upgrade\r\n"
            "Host: x\r\n"
            "Origin: x\r\n"
            "Sec-WebSocket-Key: xxxxxxxxxxxxxxxxxxxxxxxx\r\n"
            "Sec-WebSocket-Version: xx\r\n\r\n");
        break;
    case NN_WS_CLIENT:
        /*  Shortest conceiveable response from server is a terse status. */
        self->recv_len = strlen ("HTTP/1.1 xxx\r\n\r\n");
        break;
    default:
        /*  Developer error; unexpected mode. */
        nn_assert (0);
        break;
    }

    /*  Launch the state machine. */
    nn_fsm_start (&self->fsm);
}